

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiIniData * AddWindowSettings(char *name)

{
  ImU32 IVar1;
  value_type *pvVar2;
  char *pcVar3;
  
  ImVector<ImGuiIniData>::resize(&GImGui->Settings,(GImGui->Settings).Size + 1);
  pvVar2 = ImVector<ImGuiIniData>::back(&GImGui->Settings);
  pcVar3 = ImStrdup(name);
  pvVar2->Name = pcVar3;
  IVar1 = ImHash(name,0,0);
  pvVar2->Id = IVar1;
  pvVar2->Collapsed = false;
  (pvVar2->Pos).x = 3.4028235e+38;
  (pvVar2->Pos).y = 3.4028235e+38;
  (pvVar2->Size).x = 0.0;
  (pvVar2->Size).y = 0.0;
  return pvVar2;
}

Assistant:

static ImGuiIniData* AddWindowSettings(const char* name)
{
    GImGui->Settings.resize(GImGui->Settings.Size + 1);
    ImGuiIniData* ini = &GImGui->Settings.back();
    ini->Name = ImStrdup(name);
    ini->Id = ImHash(name, 0);
    ini->Collapsed = false;
    ini->Pos = ImVec2(FLT_MAX,FLT_MAX);
    ini->Size = ImVec2(0,0);
    return ini;
}